

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_binding_resolver.cpp
# Opt level: O2

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::ColumnBindingResolver::VisitReplace
          (ColumnBindingResolver *this,BoundColumnRefExpression *expr,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr_ptr)

{
  ExpressionType *this_00;
  _Head_base<0UL,_duckdb::Expression_*,_false> params_1;
  _Head_base<0UL,_duckdb::Expression_*,_false> params_2;
  reference pvVar1;
  InternalException *this_01;
  vector<duckdb::ColumnBinding,_true> *bindings;
  pointer __n;
  _func_int **local_98;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = &(expr->super_Expression).super_BaseExpression.type;
  __n = (pointer)0x0;
  while( true ) {
    if ((pointer)((long)(expr->super_Expression).super_BaseExpression.alias._M_dataplus._M_p -
                  *(long *)&(expr->super_Expression).super_BaseExpression.type >> 4) <= __n) {
      this_01 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_90,"Failed to bind column reference \"%s\" [%d.%d] (bindings: %s)"
                 ,(allocator *)&local_98);
      ::std::__cxx11::string::string((string *)&local_50,(string *)(expr_ptr + 2));
      params_1._M_head_impl =
           expr_ptr[0xb].
           super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
           super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      params_2._M_head_impl =
           expr_ptr[0xc].
           super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
           super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      LogicalOperator::ColumnBindingsToString_abi_cxx11_
                (&local_70,(LogicalOperator *)this_00,bindings);
      InternalException::
      InternalException<std::__cxx11::string,unsigned_long,unsigned_long,std::__cxx11::string>
                (this_01,&local_90,&local_50,(unsigned_long)params_1._M_head_impl,
                 (unsigned_long)params_2._M_head_impl,&local_70);
      __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pvVar1 = vector<duckdb::ColumnBinding,_true>::get<true>
                       ((vector<duckdb::ColumnBinding,_true> *)this_00,(size_type)__n);
    if ((expr_ptr[0xb].
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl ==
         (Expression *)pvVar1->table_index) &&
       (expr_ptr[0xc].super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
        ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl ==
        (Expression *)pvVar1->column_index)) break;
    __n = __n + 1;
  }
  if ((expr->super_Expression).super_BaseExpression.alias.field_2._M_local_buf[0] == '\0') {
    local_90._M_dataplus._M_p = __n;
    make_uniq<duckdb::BoundReferenceExpression,std::__cxx11::string_const&,duckdb::LogicalType&,unsigned_long&>
              ((duckdb *)&local_98,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(expr_ptr + 2),
               (LogicalType *)(expr_ptr + 7),(unsigned_long *)&local_90);
  }
  else {
    local_98 = (_func_int **)0x0;
  }
  (this->super_LogicalOperatorVisitor)._vptr_LogicalOperatorVisitor = local_98;
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> ColumnBindingResolver::VisitReplace(BoundColumnRefExpression &expr,
                                                           unique_ptr<Expression> *expr_ptr) {
	D_ASSERT(expr.depth == 0);
	// check the current set of column bindings to see which index corresponds to the column reference
	for (idx_t i = 0; i < bindings.size(); i++) {
		if (expr.binding == bindings[i]) {
			if (verify_only) {
				// in verification mode
				return nullptr;
			}
			return make_uniq<BoundReferenceExpression>(expr.GetAlias(), expr.return_type, i);
		}
	}
	// LCOV_EXCL_START
	// could not bind the column reference, this should never happen and indicates a bug in the code
	// generate an error message
	throw InternalException("Failed to bind column reference \"%s\" [%d.%d] (bindings: %s)", expr.GetAlias(),
	                        expr.binding.table_index, expr.binding.column_index,
	                        LogicalOperator::ColumnBindingsToString(bindings));
	// LCOV_EXCL_STOP
}